

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.hpp
# Opt level: O1

json __thiscall jsonrpccxx::JsonRpc2Server::ProcessSingleRequest(JsonRpc2Server *this,json *request)

{
  pointer pcVar1;
  value_t vVar2;
  bool bVar3;
  bool bVar4;
  const_reference pvVar5;
  reference pvVar6;
  JsonRpcException *pJVar7;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_RDX;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value jVar8;
  long lVar9;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_00;
  json jVar10;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  undefined1 local_170 [40];
  undefined8 local_148;
  undefined1 local_140 [40];
  undefined8 local_118;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_110;
  undefined8 local_100;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_f8;
  undefined1 local_f0 [32];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [32];
  _Base_ptr local_80 [2];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_60;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_48;
  
  pcVar1 = local_170 + 0x10;
  local_170._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"jsonrpc","");
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::find<std::__cxx11::string_const&>
            ((const_iterator *)local_140,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)in_RDX,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::cend((const_iterator *)local_f0,in_RDX);
  bVar3 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::
          operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                    ((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)local_140,(const_iterator *)local_f0);
  if (!bVar3) {
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(in_RDX,(key_type *)local_170);
    if (pvVar5->m_type == string) {
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)in_RDX,"jsonrpc");
      local_f8 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)this;
      bVar3 = nlohmann::operator!=<const_char_*,_0>(pvVar6,"2.0");
      if ((pointer)local_170._0_8_ != pcVar1) {
        operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
      }
      if (!bVar3) {
        local_170._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"method","");
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::find<std::__cxx11::string_const&>
                  ((const_iterator *)local_140,
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)in_RDX,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::cend((const_iterator *)local_f0,in_RDX);
        bVar3 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          ((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_140,(const_iterator *)local_f0);
        if (bVar3) {
          bVar3 = false;
        }
        else {
          pvVar5 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::at(in_RDX,(key_type *)local_170);
          bVar3 = pvVar5->m_type == string;
        }
        if ((pointer)local_170._0_8_ != pcVar1) {
          operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
        }
        if (!bVar3) {
          pJVar7 = (JsonRpcException *)__cxa_allocate_exception(0x60);
          local_140._0_8_ = local_140 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_140,"invalid request: method field must be a string","");
          JsonRpcException::JsonRpcException(pJVar7,-0x7f58,(string *)local_140);
          __cxa_throw(pJVar7,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
        }
        local_170._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"id","");
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::find<std::__cxx11::string_const&>
                  ((const_iterator *)local_140,
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)in_RDX,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::cend((const_iterator *)local_f0,in_RDX);
        bVar3 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          ((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_140,(const_iterator *)local_f0);
        if (bVar3) {
          if ((pointer)local_170._0_8_ != pcVar1) {
            operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
          }
        }
        else {
          bVar3 = valid_id(in_RDX);
          if ((pointer)local_170._0_8_ != pcVar1) {
            operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
          }
          if (!bVar3) {
            pJVar7 = (JsonRpcException *)__cxa_allocate_exception(0x60);
            local_140._0_8_ = local_140 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_140,
                       "invalid request: id field must be a number, string or null","");
            JsonRpcException::JsonRpcException(pJVar7,-0x7f58,(string *)local_140);
            __cxa_throw(pJVar7,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
          }
        }
        local_170._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"params","");
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::find<std::__cxx11::string_const&>
                  ((const_iterator *)local_140,
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)in_RDX,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::cend((const_iterator *)local_f0,in_RDX);
        bVar3 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          ((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_140,(const_iterator *)local_f0);
        if (!bVar3) {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)in_RDX,"params");
          if (pvVar6->m_type != array) {
            pvVar6 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)in_RDX,"params");
            if (pvVar6->m_type != object) {
              pvVar6 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                   *)in_RDX,"params");
              vVar2 = pvVar6->m_type;
              if ((pointer)local_170._0_8_ != pcVar1) {
                operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
              }
              if (vVar2 != null) {
                pJVar7 = (JsonRpcException *)__cxa_allocate_exception(0x60);
                local_140._0_8_ = local_140 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_140,
                           "invalid request: params field must be an array, object or null","");
                JsonRpcException::JsonRpcException(pJVar7,-0x7f58,(string *)local_140);
                __cxa_throw(pJVar7,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
              }
              goto LAB_00162504;
            }
          }
        }
        if ((pointer)local_170._0_8_ != pcVar1) {
          operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
        }
LAB_00162504:
        local_170._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"params","");
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::find<std::__cxx11::string_const&>
                  ((const_iterator *)local_140,
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)in_RDX,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::cend((const_iterator *)local_f0,in_RDX);
        bVar4 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          ((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_140,(const_iterator *)local_f0);
        bVar3 = true;
        if (!bVar4) {
          local_b0._0_8_ = local_c0 + 0x20;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_c0 + 0x10),"params","");
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::find<std::__cxx11::string_const&>
                    ((const_iterator *)local_140,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)in_RDX,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_c0 + 0x10));
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::cend((const_iterator *)local_f0,in_RDX);
          bVar3 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            ((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_140,(const_iterator *)local_f0);
          if (bVar3) {
            bVar3 = false;
          }
          else {
            pvVar5 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::at(in_RDX,(key_type *)(local_c0 + 0x10));
            bVar3 = pvVar5->m_type == null;
          }
        }
        if ((!bVar4) && ((_Base_ptr)local_b0._0_8_ != (_Base_ptr)(local_c0 + 0x20))) {
          operator_delete((void *)local_b0._0_8_,(ulong)((long)(_Rb_tree_color *)local_a0._0_8_ + 1)
                         );
        }
        if ((pointer)local_170._0_8_ != pcVar1) {
          operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
        }
        if (bVar3) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json(&local_70,(initializer_list_t)ZEXT816(0),false,array);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)in_RDX,"params");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator=(pvVar6,&local_70);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&local_70);
        }
        local_170._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"id","");
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::find<std::__cxx11::string_const&>
                  ((const_iterator *)local_140,
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)in_RDX,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::cend((const_iterator *)local_f0,in_RDX);
        bVar3 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          ((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_140,(const_iterator *)local_f0);
        if ((pointer)local_170._0_8_ != pcVar1) {
          operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
        }
        if (bVar3) {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)in_RDX,"method");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (local_140,pvVar6);
          this_00 = local_f8;
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)in_RDX,"params");
          Dispatcher::InvokeNotification((Dispatcher *)&request->m_value,(string *)local_140,pvVar6)
          ;
          if ((pointer)local_140._0_8_ != (pointer)(local_140 + 0x10)) {
            operator_delete((void *)local_140._0_8_,(ulong)(local_140._16_8_ + 1));
          }
          this_00->m_type = null;
          (this_00->m_value).object = (object_t *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant(this_00,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant(this_00,true);
          jVar8 = extraout_RDX;
        }
        else {
          local_f0[0] = null;
          local_f0._8_8_ = (_Base_ptr)0x0;
          nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
          construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[8],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_f0,(char (*) [8])"jsonrpc");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_f0,true);
          local_f0._16_8_ =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_f0[0x18] = 0;
          local_d0 = 0;
          nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
          construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[4],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)(local_f0 + 0x18),(char (*) [4])"2.0");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)(local_f0 + 0x18),true);
          local_c8 = 0;
          init._M_len = 2;
          init._M_array = (iterator)local_f0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_140,init,true,array);
          local_140._16_8_ =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_170._0_8_ = local_170._0_8_ & 0xffffffffffffff00;
          local_170._8_8_ = (object_t *)0x0;
          nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
          construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[3],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_170,(char (*) [3])0x180328);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_170,true);
          local_170._16_8_ = 0;
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)in_RDX,"id");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)(local_170 + 0x18),pvVar6);
          local_148 = 0;
          init_00._M_len = 2;
          init_00._M_array = (iterator)local_170;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)(local_140 + 0x18),init_00,true,array);
          local_118 = 0;
          local_60.owned_value.m_type = null;
          local_60.owned_value.m_value.object = (object_t *)0x0;
          nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
          construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[7],_0>
                    (&local_60.owned_value,(char (*) [7])"result");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant(&local_60.owned_value,true);
          local_60.value_ref = (value_type *)0x0;
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)in_RDX,"method");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (local_a0 + 0x10,pvVar6);
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::operator[]<char_const>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)in_RDX,"params");
          Dispatcher::InvokeMethod
                    ((Dispatcher *)local_c0,(string *)&request->m_value,(json *)(local_a0 + 0x10));
          nlohmann::detail::
          json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::json_ref(&local_48,(value_type *)local_c0);
          init_01._M_len = 2;
          init_01._M_array = &local_60;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json(&local_110,init_01,true,array);
          local_100 = 0;
          init_02._M_len = 3;
          init_02._M_array = (iterator)local_140;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json(local_f8,init_02,true,array);
          lVar9 = 0x30;
          do {
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)(local_140 + lVar9));
            this_00 = local_f8;
            lVar9 = lVar9 + -0x18;
          } while (lVar9 != -0x18);
          lVar9 = 0x18;
          do {
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)(&local_60.owned_value.m_type + lVar9));
            lVar9 = lVar9 + -0x18;
          } while (lVar9 != -0x18);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_c0);
          if ((_Base_ptr *)local_a0._16_8_ != local_80) {
            operator_delete((void *)local_a0._16_8_,(ulong)((long)&local_80[0]->_M_color + 1));
          }
          lVar9 = 0x18;
          do {
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)(local_170 + lVar9));
            lVar9 = lVar9 + -0x18;
          } while (lVar9 != -0x18);
          lVar9 = 0x18;
          do {
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)(local_f0 + lVar9));
            lVar9 = lVar9 + -0x18;
            jVar8 = extraout_RDX_00;
          } while (lVar9 != -0x18);
        }
        jVar10.m_value.object = jVar8.object;
        jVar10._0_8_ = this_00;
        return jVar10;
      }
      goto LAB_00162ad6;
    }
  }
  if ((pointer)local_170._0_8_ != pcVar1) {
    operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
  }
LAB_00162ad6:
  pJVar7 = (JsonRpcException *)__cxa_allocate_exception(0x60);
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,"invalid request: missing jsonrpc field set to \"2.0\"","");
  JsonRpcException::JsonRpcException(pJVar7,-0x7f58,(string *)local_140);
  __cxa_throw(pJVar7,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
}

Assistant:

json ProcessSingleRequest(json &request) {
      if (!has_key_type(request, "jsonrpc", json::value_t::string) || request["jsonrpc"] != "2.0") {
        throw JsonRpcException(invalid_request, R"(invalid request: missing jsonrpc field set to "2.0")");
      }
      if (!has_key_type(request, "method", json::value_t::string)) {
        throw JsonRpcException(invalid_request, "invalid request: method field must be a string");
      }
      if (has_key(request, "id") && !valid_id(request)) {
        throw JsonRpcException(invalid_request, "invalid request: id field must be a number, string or null");
      }
      if (has_key(request, "params") && !(request["params"].is_array() || request["params"].is_object() || request["params"].is_null())) {
        throw JsonRpcException(invalid_request, "invalid request: params field must be an array, object or null");
      }
      if (!has_key(request, "params") || has_key_type(request, "params", json::value_t::null)) {
        request["params"] = json::array();
      }
      if (!has_key(request, "id")) {
        try {
          dispatcher.InvokeNotification(request["method"], request["params"]);
          return json();
        } catch (std::exception &) {
          return json();
        }
      } else {
        return {{"jsonrpc", "2.0"}, {"id", request["id"]}, {"result", dispatcher.InvokeMethod(request["method"], request["params"])}};
      }
    }